

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutUInt8<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  ElementType val;
  reentrant_put_transaction<unsigned_char> transaction;
  uchar local_79;
  reentrant_put_transaction<unsigned_char> local_78;
  reentrant_put_transaction<unsigned_char> local_58;
  reentrant_put_transaction<unsigned_char> local_38;
  
  local_79 = '\b';
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_reentrant_emplace<unsigned_char,unsigned_char&>
            (&local_38,
             (conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             i_queue,&local_79);
  local_58.m_queue = local_38.m_queue;
  local_58.m_put_transaction.m_queue = local_38.m_put_transaction.m_queue;
  local_58.m_put_transaction.m_put_data.m_control_block =
       local_38.m_put_transaction.m_put_data.m_control_block;
  local_58.m_put_transaction.m_put_data.m_user_storage =
       local_38.m_put_transaction.m_put_data.m_user_storage;
  local_38.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_38.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_38);
  local_78.m_queue = local_58.m_queue;
  local_78.m_put_transaction.m_queue = local_58.m_put_transaction.m_queue;
  local_78.m_put_transaction.m_put_data.m_control_block =
       local_58.m_put_transaction.m_put_data.m_control_block;
  local_78.m_put_transaction.m_put_data.m_user_storage =
       local_58.m_put_transaction.m_put_data.m_user_storage;
  local_58.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_58.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_58);
  exception_checkpoint();
  __return_storage_ptr__->m_queue = local_78.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_78.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_78.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_78.m_put_transaction.m_put_data.m_user_storage;
  local_78.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_78.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_78);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                ElementType val         = 8;
                auto        transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }